

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

bool anon_unknown.dwarf_787a7::parse_internal
               (int argc,char **argv,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *unparsed_args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  Node *pNVar9;
  ostream *poVar10;
  long *plVar11;
  iterator iVar12;
  long lVar13;
  _Rb_tree_node_base *p_Var14;
  Logger *pLVar15;
  size_t sVar16;
  pointer pbVar17;
  size_type *psVar18;
  bool bVar19;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  ulong uVar20;
  _Rb_tree_node_base *p_Var21;
  char **ppcVar22;
  string program_name;
  string config_filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parsed_arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  matches;
  string local_c8;
  string local_a8;
  undefined1 local_88 [24];
  long lStack_70;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_68;
  char **local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  ulong local_38;
  
  (anonymous_namespace)::geo_argc = argc;
  (anonymous_namespace)::geo_argv = argv;
  local_68 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)unparsed_args;
  if (argc < 1) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    local_c8.field_2._M_allocated_capacity = 0x203d3e2063677261;
    local_c8.field_2._8_2_ = 0x31;
    local_c8._M_string_length = 9;
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/simogasp[P]delaunay-psm/delaunay-psm/Delaunay_psm.cpp"
               ,"");
    GEO::geo_assertion_failed(&local_c8,&local_a8,0x966);
  }
  std::__cxx11::string::string((string *)local_88,*argv,(allocator *)&local_58);
  pNVar9 = GEO::SmartPointer<GEO::FileSystem::Node>::operator->
                     ((SmartPointer<GEO::FileSystem::Node> *)&(anonymous_namespace)::root_);
  (*(pNVar9->super_Counted)._vptr_Counted[0x13])(&local_a8,pNVar9,local_88,1);
  GEO::String::to_uppercase(&local_c8,&local_a8);
  paVar1 = &local_a8.field_2;
  local_60 = argv;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  pbVar2 = (pointer)(local_88 + 0x10);
  if ((pointer)local_88._0_8_ != pbVar2) {
    operator_delete((void *)local_88._0_8_);
  }
  if ((anonymous_namespace)::parse_config_file(int,char**)::init == '\0') {
    (anonymous_namespace)::parse_config_file(int,char**)::init = '\x01';
    local_a8._M_string_length = 6;
    local_a8.field_2._M_allocated_capacity._0_7_ = 0x6769666e6f63;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    poVar10 = GEO::Logger::out(&local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Configuration file name:",0x18);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(anonymous_namespace)::config_file_name_abi_cxx11_,DAT_001aab68);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    local_a8._M_string_length = 6;
    local_a8.field_2._M_allocated_capacity._0_7_ = 0x6769666e6f63;
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    poVar10 = GEO::Logger::out(&local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Home directory:",0xf);
    pNVar9 = GEO::SmartPointer<GEO::FileSystem::Node>::operator->
                       ((SmartPointer<GEO::FileSystem::Node> *)&(anonymous_namespace)::root_);
    (*(pNVar9->super_Counted)._vptr_Counted[0xf])(local_88,pNVar9);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_88._0_8_,local_88._8_8_);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    if ((pointer)local_88._0_8_ != pbVar2) {
      operator_delete((void *)local_88._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
    pNVar9 = GEO::SmartPointer<GEO::FileSystem::Node>::operator->
                       ((SmartPointer<GEO::FileSystem::Node> *)&(anonymous_namespace)::root_);
    (*(pNVar9->super_Counted)._vptr_Counted[0xf])(&local_58,pNVar9);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_58);
    pbVar17 = (pointer)(plVar11 + 2);
    if ((pointer)*plVar11 == pbVar17) {
      local_88._16_8_ = (pbVar17->_M_dataplus)._M_p;
      lStack_70 = plVar11[3];
      local_88._0_8_ = pbVar2;
    }
    else {
      local_88._16_8_ = (pbVar17->_M_dataplus)._M_p;
      local_88._0_8_ = (pointer)*plVar11;
    }
    local_88._8_8_ = plVar11[1];
    *plVar11 = (long)pbVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    plVar11 = (long *)std::__cxx11::string::_M_append
                                (local_88,(ulong)(anonymous_namespace)::config_file_name_abi_cxx11_)
    ;
    psVar18 = (size_type *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar18) {
      local_a8.field_2._M_allocated_capacity = *psVar18;
      local_a8.field_2._8_8_ = plVar11[3];
      local_a8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar18;
      local_a8._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_a8._M_string_length = plVar11[1];
    *plVar11 = (long)psVar18;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((pointer)local_88._0_8_ != pbVar2) {
      operator_delete((void *)local_88._0_8_);
    }
    if (local_58.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&local_58.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_58.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    parse_config_file(&local_a8,&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  ppcVar22 = local_60;
  uVar20 = (anonymous_namespace)::desc_;
  pcVar3 = *local_60;
  pcVar4 = *(char **)((anonymous_namespace)::desc_ + 8);
  strlen(pcVar3);
  std::__cxx11::string::_M_replace(uVar20,0,pcVar4,(ulong)pcVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_68);
  bVar19 = true;
  if (argc != 1) {
    local_38 = 2;
    if (2 < argc) {
      local_38 = (ulong)(uint)argc;
    }
    bVar19 = true;
    uVar20 = 1;
    this = local_68;
    do {
      local_88._0_8_ = (key_type *)0x0;
      local_88._8_8_ = (pointer)0x0;
      local_88._16_8_ = (pointer)0x0;
      std::__cxx11::string::string((string *)&local_c8,ppcVar22[uVar20],(allocator *)&local_a8);
      GEO::String::split_string
                (&local_c8,'=',
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_88,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
      }
      uVar6 = local_88._0_8_;
      if (local_88._8_8_ - local_88._0_8_ == 0x40) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"dbg:","");
        iVar8 = std::__cxx11::string::compare(uVar6,0,(string *)local_c8._M_string_length);
        if (iVar8 == 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
        }
        else {
          iVar12 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                   ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::Arg>_>_>
                           *)((anonymous_namespace)::desc_ + 0x20),(key_type *)local_88._0_8_);
          uVar5 = (anonymous_namespace)::desc_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p);
          }
          if (iVar12._M_node == (_Base_ptr)(uVar5 + 0x28)) {
            local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
            local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_58.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            p_Var21 = (_Rb_tree_node_base *)((anonymous_namespace)::desc_ + 0x28);
            p_Var14 = *(_Rb_tree_node_base **)((anonymous_namespace)::desc_ + 0x38);
            this = local_68;
            ppcVar22 = local_60;
            while (local_68 = this, local_60 = ppcVar22, p_Var14 != p_Var21) {
              lVar13 = std::__cxx11::string::find
                                 ((char *)(p_Var14 + 1),
                                  (ulong)(((key_type *)local_88._0_8_)->_M_dataplus)._M_p,0);
              if (lVar13 != -1) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_58,(value_type *)(p_Var14 + 1));
              }
              p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
              this = local_68;
              ppcVar22 = local_60;
            }
            if ((long)local_58.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0x20) {
              bVar7 = GEO::CmdLine::set_arg
                                (local_58.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,
                                 (string *)(local_88._0_8_ + 0x20));
              this = local_68;
              ppcVar22 = local_60;
              if (!bVar7) {
                bVar19 = false;
              }
            }
            else {
              if ((ulong)((long)local_58.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_58.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
                pLVar15 = GEO::Logger::instance();
                pLVar15->quiet_ = false;
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CmdLine","");
                poVar10 = GEO::Logger::err(&local_c8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"Invalid argument: ",0x12);
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,((_Alloc_hider *)local_88._0_8_)->_M_p,
                                     *(size_type *)(local_88._0_8_ + 8));
                std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
              }
              else {
                pLVar15 = GEO::Logger::instance();
                pLVar15->quiet_ = false;
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"CmdLine","");
                poVar10 = GEO::Logger::err(&local_c8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"Argument is ambiguous: ",0x17);
                pcVar3 = ppcVar22[uVar20];
                if (pcVar3 == (char *)0x0) {
                  std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
                }
                else {
                  sVar16 = strlen(pcVar3);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar3,sVar16);
                }
                std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                std::ostream::put((char)poVar10);
                poVar10 = (ostream *)std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"Possible matches: ",0x12);
                GEO::String::join_strings(&local_a8,&local_58,' ');
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,local_a8._M_dataplus._M_p,local_a8._M_string_length);
                std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
                std::ostream::put((char)poVar10);
                std::ostream::flush();
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                  operator_delete(local_a8._M_dataplus._M_p);
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
              bVar19 = false;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_58);
            goto LAB_0012fcb8;
          }
        }
        bVar7 = GEO::CmdLine::set_arg((string *)local_88._0_8_,(string *)(local_88._0_8_ + 0x20));
        ppcVar22 = local_60;
        if (!bVar7) {
          bVar19 = false;
        }
      }
      else {
        std::__cxx11::string::string((string *)&local_c8,ppcVar22[uVar20],(allocator *)&local_a8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(this,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
      }
LAB_0012fcb8:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
      uVar20 = uVar20 + 1;
    } while (uVar20 != local_38);
  }
  return bVar19;
}

Assistant:

bool parse_internal(
        int argc, char** argv, std::vector<std::string>& unparsed_args
    ) {
	geo_argc = argc;
	geo_argv = argv;
	
	parse_config_file(argc, argv);
	
        bool ok = true;
        desc_->argv0 = argv[0];
        unparsed_args.clear();

        for(int i = 1; i < argc; i++) {
            std::vector<std::string> parsed_arg;
            String::split_string(argv[i], '=', parsed_arg);
            if(parsed_arg.size() != 2) {
                unparsed_args.push_back(argv[i]);
            } else {
                if(
                    String::string_starts_with(parsed_arg[0], "dbg:") ||
                    desc_->args.find(parsed_arg[0]) != desc_->args.end()
                ) {
                    if(!set_arg(parsed_arg[0], parsed_arg[1])) {
                        ok = false;
                    }
                } else {

                    std::vector<std::string> matches;
                    for( auto& it : desc_->args) {
                        if(arg_matches(parsed_arg[0], it.first)) {
                            matches.push_back(it.first);
                        }
                    }

                    if(matches.size() == 1) {
                        if(!set_arg(matches[0], parsed_arg[1])) {
                            ok = false;
                        }
                    } else if(matches.size() >= 2) {
                        ok = false;
                        Logger::instance()->set_quiet(false);
                        Logger::err("CmdLine")
                            << "Argument is ambiguous: " << argv[i]
                            << std::endl
                            << "Possible matches: "
                            << String::join_strings(matches, ' ')
                            << std::endl;
                    } else {
                        ok = false;
                        Logger::instance()->set_quiet(false);
                        Logger::err("CmdLine")
                            << "Invalid argument: " << parsed_arg[0]
                            << std::endl;
                    }
                }
            }
        }
        return ok;
    }